

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest::ComparisonTest(ComparisonTest *this)

{
  ulong uVar1;
  UnknownFieldSet *pUVar2;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ComparisonTest_01951e00;
  proto2_unittest::TestAllTypes::TestAllTypes(&this->proto1_,(Arena *)0x0);
  proto2_unittest::TestAllTypes::TestAllTypes(&this->proto2_,(Arena *)0x0);
  proto2_unittest::TestFieldOrderings::TestFieldOrderings(&this->orderings_proto1_,(Arena *)0x0);
  proto2_unittest::TestFieldOrderings::TestFieldOrderings(&this->orderings_proto2_,(Arena *)0x0);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&this->proto1ex_,(Arena *)0x0);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&this->proto2ex_,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&this->proto1diff_,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&this->proto2diff_,(Arena *)0x0);
  proto2_unittest::TestEmptyMessage::TestEmptyMessage(&this->empty1_,(Arena *)0x0);
  proto2_unittest::TestEmptyMessage::TestEmptyMessage(&this->empty2_,(Arena *)0x0);
  proto2_unittest::TestMap::TestMap(&this->map_proto1_,(Arena *)0x0);
  proto2_unittest::TestMap::TestMap(&this->map_proto2_,(Arena *)0x0);
  this->use_equivalency_ = false;
  this->repeated_field_as_set_ = false;
  (this->set_field_)._M_dataplus._M_p = (pointer)&(this->set_field_).field_2;
  (this->set_field_)._M_string_length = 0;
  (this->set_field_).field_2._M_local_buf[0] = '\0';
  (this->map_field_)._M_dataplus._M_p = (pointer)&(this->map_field_).field_2;
  (this->map_field_)._M_string_length = 0;
  (this->map_field_).field_2._M_local_buf[0] = '\0';
  (this->map_key_)._M_dataplus._M_p = (pointer)&(this->map_key_).field_2;
  (this->map_key_)._M_string_length = 0;
  (this->map_key_).field_2._M_local_buf[0] = '\0';
  (this->ignored_field_)._M_dataplus._M_p = (pointer)&(this->ignored_field_).field_2;
  (this->ignored_field_)._M_string_length = 0;
  (this->ignored_field_).field_2._M_local_buf[0] = '\0';
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&this->proto1_);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&this->proto2_);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>(&this->proto1ex_);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>(&this->proto2ex_);
  TestUtil::SetAllFieldsAndExtensions<proto2_unittest::TestFieldOrderings>(&this->orderings_proto1_)
  ;
  TestUtil::SetAllFieldsAndExtensions<proto2_unittest::TestFieldOrderings>(&this->orderings_proto2_)
  ;
  uVar1 = (this->empty1_).super_ZeroFieldsBase.super_Message.super_MessageLite._internal_metadata_.
          ptr_;
  if ((uVar1 & 1) == 0) {
    pUVar2 = protobuf::internal::InternalMetadata::
             mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                       (&(this->empty1_).super_ZeroFieldsBase.super_Message.super_MessageLite.
                         _internal_metadata_);
  }
  else {
    pUVar2 = (UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8);
  }
  this->unknown1_ = pUVar2;
  uVar1 = (this->empty2_).super_ZeroFieldsBase.super_Message.super_MessageLite._internal_metadata_.
          ptr_;
  if ((uVar1 & 1) == 0) {
    pUVar2 = protobuf::internal::InternalMetadata::
             mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                       (&(this->empty2_).super_ZeroFieldsBase.super_Message.super_MessageLite.
                         _internal_metadata_);
  }
  else {
    pUVar2 = (UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8);
  }
  this->unknown2_ = pUVar2;
  return;
}

Assistant:

ComparisonTest() : use_equivalency_(false), repeated_field_as_set_(false) {
    // Setup the test.
    TestUtil::SetAllFields(&proto1_);
    TestUtil::SetAllFields(&proto2_);

    TestUtil::SetAllExtensions(&proto1ex_);
    TestUtil::SetAllExtensions(&proto2ex_);

    TestUtil::SetAllFieldsAndExtensions(&orderings_proto1_);
    TestUtil::SetAllFieldsAndExtensions(&orderings_proto2_);

    unknown1_ = empty1_.mutable_unknown_fields();
    unknown2_ = empty2_.mutable_unknown_fields();
  }